

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(PolyKernel *a,PolyKernel *b)

{
  int32 iVar1;
  int32 iVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  PolyKernel *pPVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  double dVar5;
  PolyKernel *b_local;
  PolyKernel *a_local;
  
  pPVar3 = b;
  iVar1 = PolyKernel::degree(a);
  iVar2 = PolyKernel::degree(b);
  if (iVar1 == iVar2) {
    PolyKernel::c(a,pPVar3,extraout_RDX);
    PolyKernel::c(b,pPVar3,extraout_RDX_00);
    if ((extraout_XMM0_Qa != extraout_XMM0_Qa_00) ||
       (NAN(extraout_XMM0_Qa) || NAN(extraout_XMM0_Qa_00))) {
      a_local._7_1_ = false;
    }
    else {
      dVar4 = PolyKernel::gamma(a,extraout_XMM0_Qa);
      dVar5 = PolyKernel::gamma(b,dVar4);
      if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
        a_local._7_1_ = false;
      }
      else {
        a_local._7_1_ = true;
      }
    }
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const PolyKernel& a,
                        const PolyKernel& b) {
            if (a.degree() != b.degree()) {
                return false;
            }
            if (a.c() != b.c()) {
                return false;
            }
            if (a.gamma() != b.gamma()) {
                return false;
            }
            return true;
        }